

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache.cc
# Opt level: O3

bool __thiscall
ctemplate::TemplateCache::LoadTemplate(TemplateCache *this,TemplateString *filename,Strip strip)

{
  int iVar1;
  Mutex *pMVar2;
  RefcountedTemplate *pRVar3;
  TemplateCacheKey cache_key;
  TemplateCacheKey local_30;
  
  local_30.first = TemplateString::GetGlobalId(filename);
  pMVar2 = this->mutex_;
  iVar1 = pMVar2->mutex_;
  pMVar2->mutex_ = pMVar2->mutex_ + -1;
  local_30.second = strip;
  if (iVar1 != 0) {
    __assert_fail("--mutex_ == -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/base/mutex.h"
                  ,0xea,"void ctemplate::Mutex::Lock()");
  }
  pRVar3 = GetTemplateLocked(this,filename,strip,&local_30);
  pMVar2->mutex_ = pMVar2->mutex_ + 1;
  if (pMVar2->mutex_ == 0) {
    return pRVar3 != (RefcountedTemplate *)0x0;
  }
  __assert_fail("mutex_++ == -1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/base/mutex.h"
                ,0xeb,"void ctemplate::Mutex::Unlock()");
}

Assistant:

bool TemplateCache::LoadTemplate(const TemplateString& filename, Strip strip) {
  TemplateCacheKey cache_key = TemplateCacheKey(filename.GetGlobalId(), strip);
  WriterMutexLock ml(mutex_);
  return GetTemplateLocked(filename, strip, cache_key) != NULL;
}